

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglApiCase.cpp
# Opt level: O3

void __thiscall deqp::egl::ApiCase::expectNull(ApiCase *this,void *got)

{
  ostringstream *this_00;
  TestContext *this_01;
  undefined1 local_190 [384];
  
  if (got != (void *)0x0) {
    local_190._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_190 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR expected: NULL",0x17);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x78));
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (this_01->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Got invalid value");
    }
  }
  return;
}

Assistant:

void ApiCase::expectNull (const void* got)
{
	if (got != DE_NULL)
	{
		m_testCtx.getLog() << TestLog::Message << "// ERROR expected: NULL" << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid value");
	}
}